

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

bool __thiscall helics::Federate::getFlagOption(Federate *this,int flag)

{
  int iVar1;
  element_type *peVar2;
  uint in_ESI;
  long in_RDI;
  bool local_1;
  
  if (in_ESI == 0x1b) {
    local_1 = (bool)(*(byte *)(in_RDI + 0xe) & 1);
  }
  else if (in_ESI == 0x4f) {
    local_1 = (bool)(*(byte *)(in_RDI + 0xb) & 1);
  }
  else if (in_ESI == 0x6a) {
    local_1 = (bool)(*(byte *)(in_RDI + 0xd) & 1);
  }
  else {
    peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3428b5);
    iVar1 = (*peVar2->_vptr_Core[0x23])(peVar2,(ulong)*(uint *)(in_RDI + 0x10),(ulong)in_ESI);
    local_1 = (bool)((byte)iVar1 & 1);
  }
  return local_1;
}

Assistant:

bool Federate::getFlagOption(int flag) const
{
    switch (flag) {
        case defs::Flags::USE_JSON_SERIALIZATION:
            return useJsonSerialization;
        case defs::Flags::AUTOMATED_TIME_REQUEST:
            return retriggerTimeRequest;
        case defs::Flags::SINGLE_THREAD_FEDERATE:
            return singleThreadFederate;
        default:
            return coreObject->getFlagOption(fedID, flag);
    }
}